

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::OptionsValue
          (string *__return_storage_ptr__,Generator *this,string *serialized_options)

{
  bool bVar1;
  long lVar2;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator local_21;
  string *local_20;
  string *serialized_options_local;
  Generator *this_local;
  
  local_20 = serialized_options;
  serialized_options_local = (string *)this;
  this_local = (Generator *)__return_storage_ptr__;
  lVar2 = std::__cxx11::string::length();
  if ((lVar2 != 0) && (bVar1 = GeneratingDescriptorProto(this), !bVar1)) {
    CEscape(&local_78,local_20);
    std::operator+(&local_58,"b\'",&local_78);
    std::operator+(__return_storage_ptr__,&local_58,"\'");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"None",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::OptionsValue(
    const std::string& serialized_options) const {
  if (serialized_options.length() == 0 || GeneratingDescriptorProto()) {
    return "None";
  } else {
    return "b'" + CEscape(serialized_options) + "'";
  }
}